

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currencies.cpp
# Opt level: O0

bool bidfx_public_api::price::Currencies::IsValidCurrencyAndPair(string *ccy,string *ccy_pair)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  string *psVar6;
  undefined1 local_29;
  undefined1 local_19;
  string *ccy_pair_local;
  string *ccy_local;
  
  uVar2 = std::__cxx11::string::length();
  uVar3 = std::__cxx11::string::length();
  local_19 = false;
  if (uVar3 < uVar2) {
    lVar4 = std::__cxx11::string::length();
    lVar5 = std::__cxx11::string::length();
    psVar6 = (string *)std::__cxx11::string::length();
    iVar1 = std::__cxx11::string::compare((ulong)ccy_pair,lVar4 - lVar5,psVar6);
    local_29 = true;
    if (iVar1 != 0) {
      psVar6 = (string *)std::__cxx11::string::length();
      iVar1 = std::__cxx11::string::compare((ulong)ccy_pair,0,psVar6);
      local_29 = iVar1 == 0;
    }
    local_19 = local_29;
  }
  return local_19;
}

Assistant:

bool Currencies::IsValidCurrencyAndPair(const std::string& ccy, const std::string& ccy_pair)
{
    return (ccy_pair.length() > ccy.length() && // currency fits into currency pair
               (ccy_pair.compare(ccy_pair.length() - ccy.length(), ccy.length(), ccy) == 0 || // currency at end of currency pair
                ccy_pair.compare(0, ccy.length(), ccy) == 0)); // currency at start of currency pair
}